

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen11CachePolicyULT.cpp
# Opt level: O3

void __thiscall CTestGen11CachePolicy::CheckL3CachePolicy(CTestGen11CachePolicy *this)

{
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  long *plVar1;
  bool bVar2;
  uint extraout_var;
  char *pcVar3;
  ulong uVar4;
  undefined1 local_88 [8];
  GMM_CACHE_POLICY_ELEMENT ClientRequest;
  uint local_58;
  uint32_t L3_WB_CACHEABLE;
  uint32_t L3_UNCACHEABLE;
  uint32_t AssignedMocsIdx;
  internal local_48 [8];
  AssertionResult gtest_ar;
  
  ClientRequest.IsOverridenByRegkey = 3;
  local_58 = 1;
  uVar4 = 0;
  this_00 = &gtest_ar.message_;
  do {
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x70))
              (local_88,CommonULT::pGmmULTClientContext,uVar4 & 0xffffffff);
    L3_WB_CACHEABLE = (uint)ClientRequest.field_1.Value._0_4_ >> 1 & 0x3f;
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x78))();
    gtest_ar.message_.ptr_._0_2_ = 0;
    gtest_ar.message_.ptr_._2_2_ = 0;
    L3_UNCACHEABLE._0_2_ = (ushort)extraout_var & 1;
    testing::internal::CmpHelperEQ<int,unsigned_short>
              (local_48,"0","Mocs.L3.ESC",(int *)this_00,(unsigned_short *)&L3_UNCACHEABLE);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                           CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_)) +
                 0x10),"Usage# ",7);
      std::ostream::_M_insert<unsigned_long>
                (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                          CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_)) +
                 0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                           CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_)) +
                 0x10),": ESC is non-zero",0x11);
      pcVar3 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar3 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&L3_UNCACHEABLE,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11CachePolicyULT.cpp"
                 ,0x49,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&L3_UNCACHEABLE,(Message *)this_00)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&L3_UNCACHEABLE);
      if (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                   CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_)) != 0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (plVar1 = (long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,
                                      CONCAT22(gtest_ar.message_.ptr_._2_2_,
                                               (ushort)gtest_ar.message_.ptr_)),
           plVar1 != (long *)0x0)) {
          (**(code **)(*plVar1 + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_._0_2_ = 0;
    gtest_ar.message_.ptr_._2_2_ = 0;
    L3_UNCACHEABLE._0_2_ = (ushort)(extraout_var >> 1) & 7;
    testing::internal::CmpHelperEQ<int,unsigned_short>
              (local_48,"0","Mocs.L3.SCC",(int *)this_00,(unsigned_short *)&L3_UNCACHEABLE);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                           CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_)) +
                 0x10),"Usage# ",7);
      std::ostream::_M_insert<unsigned_long>
                (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                          CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_)) +
                 0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                           CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_)) +
                 0x10),": SCC is non-zero",0x11);
      pcVar3 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar3 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&L3_UNCACHEABLE,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11CachePolicyULT.cpp"
                 ,0x4a,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&L3_UNCACHEABLE,(Message *)this_00)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&L3_UNCACHEABLE);
      if (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                   CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_)) != 0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (plVar1 = (long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,
                                      CONCAT22(gtest_ar.message_.ptr_._2_2_,
                                               (ushort)gtest_ar.message_.ptr_)),
           plVar1 != (long *)0x0)) {
          (**(code **)(*plVar1 + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_._0_2_ = 0;
    gtest_ar.message_.ptr_._2_2_ = 0;
    L3_UNCACHEABLE._0_2_ = (ushort)(extraout_var >> 8) & 0xff;
    testing::internal::CmpHelperEQ<int,unsigned_short>
              (local_48,"0","Mocs.L3.Reserved",(int *)this_00,(unsigned_short *)&L3_UNCACHEABLE);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                           CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_)) +
                 0x10),"Usage# ",7);
      std::ostream::_M_insert<unsigned_long>
                (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                          CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_)) +
                 0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                           CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_)) +
                 0x10),": Reserved field is non-zero",0x1c);
      pcVar3 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar3 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&L3_UNCACHEABLE,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11CachePolicyULT.cpp"
                 ,0x4b,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&L3_UNCACHEABLE,(Message *)this_00)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&L3_UNCACHEABLE);
      if (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                   CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_)) != 0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (plVar1 = (long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,
                                      CONCAT22(gtest_ar.message_.ptr_._2_2_,
                                               (ushort)gtest_ar.message_.ptr_)),
           plVar1 != (long *)0x0)) {
          (**(code **)(*plVar1 + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    gtest_ar.message_.ptr_._0_2_ = 0x40;
    gtest_ar.message_.ptr_._2_2_ = 0;
    testing::internal::CmpHelperGT<int,unsigned_int>
              (local_48,"(64)","AssignedMocsIdx",(int *)this_00,&L3_WB_CACHEABLE);
    if (local_48[0] == (internal)0x0) {
      testing::Message::Message((Message *)this_00);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                           CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_)) +
                 0x10),"Usage# ",7);
      std::ostream::_M_insert<unsigned_long>
                (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                          CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_)) +
                 0x10);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)
                 (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                           CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_)) +
                 0x10),": MOCS Index greater than MAX allowed (62)",0x2a);
      pcVar3 = "";
      if (gtest_ar._0_8_ != 0) {
        pcVar3 = *(char **)gtest_ar._0_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&L3_UNCACHEABLE,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11CachePolicyULT.cpp"
                 ,0x4e,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&L3_UNCACHEABLE,(Message *)this_00)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&L3_UNCACHEABLE);
      if (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                   CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_)) != 0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (plVar1 = (long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,
                                      CONCAT22(gtest_ar.message_.ptr_._2_2_,
                                               (ushort)gtest_ar.message_.ptr_)),
           plVar1 != (long *)0x0)) {
          (**(code **)(*plVar1 + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if ((ClientRequest.IDCode._2_1_ & 4) == 0) {
      if ((int)uVar4 == 0x3a) {
        gtest_ar.message_.ptr_._0_2_ = 0x3f;
        gtest_ar.message_.ptr_._2_2_ = 0;
        testing::internal::CmpHelperEQ<unsigned_int,int>
                  (local_48,"AssignedMocsIdx","63",&L3_WB_CACHEABLE,(int *)this_00);
        if (local_48[0] == (internal)0x0) {
          testing::Message::Message((Message *)this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)
                     (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                               CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_)
                              ) + 0x10),"Usage# ",7);
          std::ostream::_M_insert<unsigned_long>
                    (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                              CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_))
                     + 0x10);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)
                     (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                               CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_)
                              ) + 0x10),": Incorrect Index for MOCS63 usage",0x22);
          pcVar3 = "";
          if (gtest_ar._0_8_ != 0) {
            pcVar3 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&L3_UNCACHEABLE,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11CachePolicyULT.cpp"
                     ,0x5d,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&L3_UNCACHEABLE,(Message *)this_00);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&L3_UNCACHEABLE);
          if (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                       CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_)) != 0)
          {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               (plVar1 = (long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,
                                          CONCAT22(gtest_ar.message_.ptr_._2_2_,
                                                   (ushort)gtest_ar.message_.ptr_)),
               plVar1 != (long *)0x0)) {
              (**(code **)(*plVar1 + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else if ((int)uVar4 == 0x39) {
        gtest_ar.message_.ptr_._0_2_ = 0x3e;
        gtest_ar.message_.ptr_._2_2_ = 0;
        testing::internal::CmpHelperEQ<unsigned_int,int>
                  (local_48,"AssignedMocsIdx","62",&L3_WB_CACHEABLE,(int *)this_00);
        if (local_48[0] == (internal)0x0) {
          testing::Message::Message((Message *)this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)
                     (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                               CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_)
                              ) + 0x10),"Usage# ",7);
          std::ostream::_M_insert<unsigned_long>
                    (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                              CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_))
                     + 0x10);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)
                     (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                               CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_)
                              ) + 0x10),": Incorrect Index for MOCS62 usage",0x22);
          pcVar3 = "";
          if (gtest_ar._0_8_ != 0) {
            pcVar3 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&L3_UNCACHEABLE,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11CachePolicyULT.cpp"
                     ,0x59,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&L3_UNCACHEABLE,(Message *)this_00);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&L3_UNCACHEABLE);
          if (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                       CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_)) != 0)
          {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               (plVar1 = (long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,
                                          CONCAT22(gtest_ar.message_.ptr_._2_2_,
                                                   (ushort)gtest_ar.message_.ptr_)),
               plVar1 != (long *)0x0)) {
              (**(code **)(*plVar1 + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        gtest_ar.message_.ptr_._0_2_ = 0x30;
        gtest_ar.message_.ptr_._2_2_ = 0;
        testing::internal::CmpHelperLT<unsigned_int,int>
                  (local_48,"AssignedMocsIdx","(48)",&L3_WB_CACHEABLE,(int *)this_00);
        if (local_48[0] == (internal)0x0) {
          testing::Message::Message((Message *)this_00);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)
                     (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                               CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_)
                              ) + 0x10),"Usage# ",7);
          std::ostream::_M_insert<unsigned_long>
                    (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                              CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_))
                     + 0x10);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)
                     (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                               CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_)
                              ) + 0x10),": Incorrect Index for HDCL1 setting",0x23);
          pcVar3 = "";
          if (gtest_ar._0_8_ != 0) {
            pcVar3 = *(char **)gtest_ar._0_8_;
          }
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&L3_UNCACHEABLE,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11CachePolicyULT.cpp"
                     ,0x61,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&L3_UNCACHEABLE,(Message *)this_00);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&L3_UNCACHEABLE);
          if (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                       CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_)) != 0)
          {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               (plVar1 = (long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,
                                          CONCAT22(gtest_ar.message_.ptr_._2_2_,
                                                   (ushort)gtest_ar.message_.ptr_)),
               plVar1 != (long *)0x0)) {
              (**(code **)(*plVar1 + 8))();
            }
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)&gtest_ar,
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
    }
    else {
      gtest_ar.message_.ptr_._0_2_ = 0x30;
      gtest_ar.message_.ptr_._2_2_ = 0;
      testing::internal::CmpHelperGE<unsigned_int,int>
                (local_48,"AssignedMocsIdx","(48)",&L3_WB_CACHEABLE,(int *)this_00);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)
                   (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                             CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_))
                   + 0x10),"Usage# ",7);
        std::ostream::_M_insert<unsigned_long>
                  (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                            CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_)) +
                   0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)
                   (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                             CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_))
                   + 0x10),": Incorrect Index for HDCL1 setting",0x23);
        pcVar3 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar3 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&L3_UNCACHEABLE,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11CachePolicyULT.cpp"
                   ,0x53,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&L3_UNCACHEABLE,(Message *)this_00);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&L3_UNCACHEABLE);
        if (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                     CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_)) != 0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (plVar1 = (long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,
                                        CONCAT22(gtest_ar.message_.ptr_._2_2_,
                                                 (ushort)gtest_ar.message_.ptr_)),
             plVar1 != (long *)0x0)) {
            (**(code **)(*plVar1 + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    gtest_ar.message_.ptr_._0_2_ = (ushort)(extraout_var >> 4) & 3;
    if (((byte)ClientRequest.IDCode & 4) == 0) {
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_short>
                (local_48,"L3_UNCACHEABLE","Mocs.L3.Cacheability",&local_58,
                 (unsigned_short *)this_00);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)
                   (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                             CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_))
                   + 0x10),"Usage# ",7);
        std::ostream::_M_insert<unsigned_long>
                  (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                            CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_)) +
                   0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)
                   (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                             CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_))
                   + 0x10),": Incorrect L3 cachebility setting",0x22);
        pcVar3 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar3 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&L3_UNCACHEABLE,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11CachePolicyULT.cpp"
                   ,0x6b,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&L3_UNCACHEABLE,(Message *)this_00);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&L3_UNCACHEABLE);
        if (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                     CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_)) != 0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (plVar1 = (long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,
                                        CONCAT22(gtest_ar.message_.ptr_._2_2_,
                                                 (ushort)gtest_ar.message_.ptr_)),
             plVar1 != (long *)0x0)) {
            (**(code **)(*plVar1 + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_short>
                (local_48,"L3_WB_CACHEABLE","Mocs.L3.Cacheability",
                 &ClientRequest.IsOverridenByRegkey,(unsigned_short *)this_00);
      if (local_48[0] == (internal)0x0) {
        testing::Message::Message((Message *)this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)
                   (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                             CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_))
                   + 0x10),"Usage# ",7);
        std::ostream::_M_insert<unsigned_long>
                  (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                            CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_)) +
                   0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)
                   (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                             CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_))
                   + 0x10),": Incorrect L3 cachebility setting",0x22);
        pcVar3 = "";
        if (gtest_ar._0_8_ != 0) {
          pcVar3 = *(char **)gtest_ar._0_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&L3_UNCACHEABLE,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/intel[P]gmmlib/Source/GmmLib/ULT/GmmGen11CachePolicyULT.cpp"
                   ,0x67,pcVar3);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&L3_UNCACHEABLE,(Message *)this_00);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&L3_UNCACHEABLE);
        if (CONCAT44(gtest_ar.message_.ptr_._4_4_,
                     CONCAT22(gtest_ar.message_.ptr_._2_2_,(ushort)gtest_ar.message_.ptr_)) != 0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (plVar1 = (long *)CONCAT44(gtest_ar.message_.ptr_._4_4_,
                                        CONCAT22(gtest_ar.message_.ptr_._2_2_,
                                                 (ushort)gtest_ar.message_.ptr_)),
             plVar1 != (long *)0x0)) {
            (**(code **)(*plVar1 + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&gtest_ar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    uVar4 = uVar4 + 1;
  } while (uVar4 != 0x11e);
  return;
}

Assistant:

void CTestGen11CachePolicy::CheckL3CachePolicy()
{
    const uint32_t L3_WB_CACHEABLE = 0x3;
    const uint32_t L3_UNCACHEABLE  = 0x1;

    // Check Usage MOCS index against MOCS settings
    for(uint32_t Usage = GMM_RESOURCE_USAGE_UNKNOWN; Usage < GMM_RESOURCE_USAGE_MAX; Usage++)
    {
        GMM_CACHE_POLICY_ELEMENT     ClientRequest   = pGmmULTClientContext->GetCachePolicyElement((GMM_RESOURCE_USAGE_TYPE)Usage);
        uint32_t                     AssignedMocsIdx = ClientRequest.MemoryObjectOverride.Gen11.Index;
        GMM_CACHE_POLICY_TBL_ELEMENT Mocs            = pGmmULTClientContext->GetCachePolicyTlbElement(AssignedMocsIdx);

        EXPECT_EQ(0, Mocs.L3.ESC) << "Usage# " << Usage << ": ESC is non-zero";
        EXPECT_EQ(0, Mocs.L3.SCC) << "Usage# " << Usage << ": SCC is non-zero";
        EXPECT_EQ(0, Mocs.L3.Reserved) << "Usage# " << Usage << ": Reserved field is non-zero";

        // Check if Mocs Index is not greater than GMM_GEN9_MAX_NUMBER_MOCS_INDEXES
        EXPECT_GT(GMM_MAX_NUMBER_MOCS_INDEXES, AssignedMocsIdx) << "Usage# " << Usage << ": MOCS Index greater than MAX allowed (62)";

        // Check of assigned Index setting is appropriate for HDCL1 setting
        if(ClientRequest.HDCL1)
        {
            EXPECT_GE(AssignedMocsIdx, GMM_GEN10_HDCL1_MOCS_INDEX_START) << "Usage# " << Usage << ": Incorrect Index for HDCL1 setting";
        }
        else
        {
            if(Usage == GMM_RESOURCE_USAGE_MOCS_62)
            {
                EXPECT_EQ(AssignedMocsIdx, 62) << "Usage# " << Usage << ": Incorrect Index for MOCS62 usage";
            }
            else if(Usage == GMM_RESOURCE_USAGE_L3_EVICTION)
            {
                EXPECT_EQ(AssignedMocsIdx, 63) << "Usage# " << Usage << ": Incorrect Index for MOCS63 usage";
            }
            else
            {
                EXPECT_LT(AssignedMocsIdx, GMM_GEN10_HDCL1_MOCS_INDEX_START) << "Usage# " << Usage << ": Incorrect Index for HDCL1 setting";
            }
        }

        if(ClientRequest.L3)
        {
            EXPECT_EQ(L3_WB_CACHEABLE, Mocs.L3.Cacheability) << "Usage# " << Usage << ": Incorrect L3 cachebility setting";
        }
        else
        {
            EXPECT_EQ(L3_UNCACHEABLE, Mocs.L3.Cacheability) << "Usage# " << Usage << ": Incorrect L3 cachebility setting";
        }
    }
}